

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

InMemoryFileFactory * kj::memfdInMemoryFileFactory(void)

{
  return &memfdInMemoryFileFactory::instance.super_InMemoryFileFactory;
}

Assistant:

const InMemoryFileFactory& memfdInMemoryFileFactory() {
  class FactoryImpl: public InMemoryFileFactory {
  public:
    kj::Own<const File> create(const Clock& clock) const override {
      return newMemfdFile(0);
    }
  };
  static const FactoryImpl instance;
  return instance;
}